

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O2

uintwide_t<512U,_unsigned_int,_void,_false> * __thiscall
math::wide_integer::uintwide_t<512U,_unsigned_int,_void,_false>::operator*=
          (uintwide_t<512U,_unsigned_int,_void,_false> *this,
          uintwide_t<512U,_unsigned_int,_void,_false> *other)

{
  uintwide_t<512U,_unsigned_int,_void,_false> other_as_self_copy;
  uintwide_t<512U,_unsigned_int,_void,_false> local_48;
  
  if (this == other) {
    local_48.values.super_array<unsigned_int,_16UL>.elems._0_8_ =
         *(undefined8 *)(other->values).super_array<unsigned_int,_16UL>.elems;
    local_48.values.super_array<unsigned_int,_16UL>.elems._8_8_ =
         *(undefined8 *)((other->values).super_array<unsigned_int,_16UL>.elems + 2);
    local_48.values.super_array<unsigned_int,_16UL>.elems._16_8_ =
         *(undefined8 *)((other->values).super_array<unsigned_int,_16UL>.elems + 4);
    local_48.values.super_array<unsigned_int,_16UL>.elems._24_8_ =
         *(undefined8 *)((other->values).super_array<unsigned_int,_16UL>.elems + 6);
    local_48.values.super_array<unsigned_int,_16UL>.elems._32_8_ =
         *(undefined8 *)((other->values).super_array<unsigned_int,_16UL>.elems + 8);
    local_48.values.super_array<unsigned_int,_16UL>.elems._40_8_ =
         *(undefined8 *)((other->values).super_array<unsigned_int,_16UL>.elems + 10);
    local_48.values.super_array<unsigned_int,_16UL>.elems._48_8_ =
         *(undefined8 *)((other->values).super_array<unsigned_int,_16UL>.elems + 0xc);
    local_48.values.super_array<unsigned_int,_16UL>.elems._56_8_ =
         *(undefined8 *)((other->values).super_array<unsigned_int,_16UL>.elems + 0xe);
    other = &local_48;
  }
  void_math::wide_integer::uintwide_t<512u,unsigned_int,void,false>::eval_mul_unary<512u>(math::
  wide_integer::uintwide_t<512u,unsigned_int,void,false>&,math::wide_integer::
  uintwide_t<512u,unsigned_int,void,false>const&,std::enable_if<((512u)/std::
  numeric_limits<unsigned_int>::digits)<math::wide_integer::uintwide_t<512u,unsigned_int,void,false>
  ::number_of_limbs_karatsuba_threshold,void>::type__
            (this,other,
             (enable_if_t<((512U___std::numeric_limits<unsigned_int>::digits)_<_number_of_limbs_karatsuba_threshold)>
              *)0x0);
  return this;
}

Assistant:

constexpr auto operator*=(const uintwide_t& other) -> uintwide_t&
    {
      if(this == &other)
      {
        const uintwide_t other_as_self_copy(other); // NOLINT(performance-unnecessary-copy-initialization)

        eval_mul_unary(*this, other_as_self_copy);
      }
      else
      {
        eval_mul_unary(*this, other);
      }

      return *this;
    }